

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_texture_gather_instruction
               (bool compare,bool raw,Impl *impl,CallInst *instruction)

{
  initializer_list<unsigned_int> __l;
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  Id IVar4;
  uint uVar5;
  Value *pVVar6;
  mapped_type *pmVar7;
  Type *pTVar8;
  Operation *pOVar9;
  bool local_1b9;
  Type *target_type_1;
  Type *target_type;
  Id u64_vector;
  Operation *bitcast_64;
  Id local_158;
  Id value;
  Id components [2];
  Operation *extr1;
  Operation *extr0;
  uint i_1;
  Operation *extract_value;
  Id local_128;
  Id gather_result;
  Id components64 [4];
  initializer_list<unsigned_int> local_108;
  Operation *local_f8;
  Operation *op_green;
  Id texel_offset_id;
  Id local_e4;
  initializer_list<unsigned_int> local_e0;
  Operation *local_d0;
  Operation *op;
  Op opcode;
  bool raw_gather64;
  Id IStack_bc;
  Op *local_b8;
  undefined8 local_b0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_a8;
  Id local_8c;
  Id local_88;
  Id sample_type;
  Id texel_type;
  ComponentType effective_component_type;
  bool sparse;
  mapped_type *local_78;
  mapped_type *access_meta;
  Id aux_id;
  Id coord_id;
  uint i;
  uint32_t image_flags;
  Id offsets [2];
  Id coords [4];
  uint32_t num_coords;
  uint32_t num_coords_full;
  mapped_type *meta;
  Id combined_image_sampler_id;
  Id sampler_id;
  Id image_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  bool raw_local;
  bool compare_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  impl_local._5_1_ = raw;
  impl_local._6_1_ = compare;
  bVar2 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (bVar2) {
    _sampler_id = Converter::Impl::builder((Impl *)instruction_local);
    pCVar1 = instruction_local;
    pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    combined_image_sampler_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
    pCVar1 = instruction_local;
    pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
    IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
    IVar3 = Converter::Impl::build_sampled_image
                      ((Impl *)instruction_local,combined_image_sampler_id,IVar3,false);
    pmVar7 = std::
             unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
             ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                           *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                              _M_rehash_policy._M_next_resize,&combined_image_sampler_id);
    coords[3] = 0;
    coords[2] = 0;
    bVar2 = get_image_dimensions
                      ((Impl *)instruction_local,combined_image_sampler_id,coords + 3,coords + 2);
    if (bVar2) {
      memset(offsets,0,0x10);
      memset(&i,0,8);
      coord_id = 0;
      for (aux_id = 0; pCVar1 = instruction_local, aux_id < coords[3]; aux_id = aux_id + 1) {
        pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,aux_id + 3);
        IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
        offsets[aux_id] = IVar4;
      }
      IVar4 = spv::Builder::makeFloatType(_sampler_id,0x20);
      access_meta._4_4_ = Converter::Impl::build_vector((Impl *)pCVar1,IVar4,offsets,coords[3]);
      if ((coords[2] != 2) ||
         (bVar2 = get_texel_offsets((Impl *)instruction_local,(CallInst *)builder,&coord_id,7,2,&i,
                                    true), bVar2)) {
        pCVar1 = instruction_local;
        if ((impl_local._5_1_ & 1) == 0) {
          if ((impl_local._6_1_ & 1) == 0) {
            pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,9);
            access_meta._0_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
          }
          else {
            pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,10);
            access_meta._0_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
          }
        }
        else {
          access_meta._0_4_ = spv::Builder::makeUintConstant(_sampler_id,0,false);
        }
        _texel_type = builder;
        local_78 = std::
                   unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                   ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                                 *)&instruction_local[10].super_Instruction.attachments._M_h.
                                    _M_before_begin,(key_type *)&texel_type);
        sample_type._3_1_ = (local_78->access_mask & 0x10) != 0;
        if ((bool)sample_type._3_1_) {
          spv::Builder::addCapability(_sampler_id,CapabilitySparseResidency);
        }
        sample_type._2_1_ =
             Converter::Impl::get_effective_typed_resource_type(pmVar7->component_type);
        local_8c = Converter::Impl::get_type_id
                             ((Impl *)instruction_local,sample_type._2_1_,1,4,false);
        pCVar1 = instruction_local;
        local_88 = local_8c;
        if ((sample_type._3_1_ & 1) != 0) {
          opcode = spv::Builder::makeUintType(_sampler_id,0x20);
          IStack_bc = local_88;
          local_b8 = &opcode;
          local_b0 = 2;
          __l._M_len = 2;
          __l._M_array = local_b8;
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                    (&local_a8,__l,(allocator_type *)((long)&op + 7));
          local_8c = Converter::Impl::get_struct_type((Impl *)pCVar1,&local_a8,0,"SparseTexel");
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                    (&local_a8);
        }
        local_1b9 = false;
        if ((impl_local._5_1_ & 1) != 0) {
          pTVar8 = LLVMBC::Value::getType((Value *)builder);
          pTVar8 = LLVMBC::Type::getStructElementType(pTVar8,0);
          uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar8);
          local_1b9 = uVar5 == 0x40;
        }
        op._6_1_ = local_1b9;
        if ((impl_local._6_1_ & 1) == 0) {
          op._0_4_ = OpImageGather;
          if ((sample_type._3_1_ & 1) != 0) {
            op._0_4_ = OpImageSparseGather;
          }
        }
        else {
          op._0_4_ = OpImageDrefGather;
          if ((sample_type._3_1_ & 1) != 0) {
            op._0_4_ = OpImageSparseDrefGather;
          }
        }
        local_d0 = Converter::Impl::allocate
                             ((Impl *)instruction_local,(Op)op,(Value *)builder,local_8c);
        pCVar1 = instruction_local;
        if ((sample_type._3_1_ & 1) == 0) {
          pTVar8 = LLVMBC::Value::getType((Value *)builder);
          pTVar8 = LLVMBC::Type::getStructElementType(pTVar8,0);
          Converter::Impl::decorate_relaxed_precision((Impl *)pCVar1,pTVar8,local_d0->id,true);
        }
        texel_offset_id = access_meta._4_4_;
        local_e4 = (Id)access_meta;
        local_e0._M_array = (iterator)((long)&op_green + 4);
        local_e0._M_len = 3;
        op_green._4_4_ = IVar3;
        Operation::add_ids(local_d0,&local_e0);
        op_green._0_4_ = 0;
        if (coord_id != 0) {
          Operation::add_literal(local_d0,coord_id);
          op_green._0_4_ =
               build_texel_offset_vector((Impl *)instruction_local,&i,coords[2],coord_id,true);
          Operation::add_id(local_d0,(Id)op_green);
        }
        Converter::Impl::add((Impl *)instruction_local,local_d0,false);
        if ((op._6_1_ & 1) == 0) {
          pTVar8 = LLVMBC::Value::getType((Value *)builder);
          pTVar8 = LLVMBC::Type::getStructElementType(pTVar8,0);
          if ((sample_type._3_1_ & 1) == 0) {
            Converter::Impl::fixup_load_type_typed
                      ((Impl *)instruction_local,pmVar7->component_type,4,(Value *)builder,pTVar8);
            build_exploded_composite_from_vector((Impl *)instruction_local,(Instruction *)builder,4)
            ;
          }
          else {
            Converter::Impl::repack_sparse_feedback
                      ((Impl *)instruction_local,pmVar7->component_type,4,(Value *)builder,pTVar8,0)
            ;
          }
        }
        else {
          pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpImageGather,local_88);
          components64[3] = IVar3;
          local_f8 = pOVar9;
          spv::Builder::makeUintConstant(_sampler_id,1,false);
          local_108._M_array = components64 + 3;
          local_108._M_len = 3;
          Operation::add_ids(pOVar9,&local_108);
          if (coord_id != 0) {
            Operation::add_literal(local_f8,coord_id);
            Operation::add_id(local_f8,(Id)op_green);
          }
          Converter::Impl::add((Impl *)instruction_local,local_f8,false);
          if ((sample_type._3_1_ & 1) == 0) {
            extract_value._4_4_ = local_d0->id;
          }
          else {
            pOVar9 = Converter::Impl::allocate
                               ((Impl *)instruction_local,OpCompositeExtract,local_88);
            extract_value._4_4_ = pOVar9->id;
            Operation::add_id(pOVar9,local_d0->id);
            Operation::add_literal(pOVar9,1);
            Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          }
          for (extr0._4_4_ = 0; pCVar1 = instruction_local, extr0._4_4_ < 4;
              extr0._4_4_ = extr0._4_4_ + 1) {
            IVar3 = spv::Builder::makeUintType(_sampler_id,0x20);
            pOVar9 = Converter::Impl::allocate((Impl *)pCVar1,OpCompositeExtract,IVar3);
            pCVar1 = instruction_local;
            IVar3 = spv::Builder::makeUintType(_sampler_id,0x20);
            components = (Id  [2])Converter::Impl::allocate((Impl *)pCVar1,OpCompositeExtract,IVar3)
            ;
            Operation::add_id(pOVar9,extract_value._4_4_);
            Operation::add_literal(pOVar9,extr0._4_4_);
            Operation::add_id((Operation *)components,local_f8->id);
            Operation::add_literal((Operation *)components,extr0._4_4_);
            Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
            Converter::Impl::add((Impl *)instruction_local,(Operation *)components,false);
            pCVar1 = instruction_local;
            local_158 = pOVar9->id;
            value = *(Id *)((long)components + 4);
            IVar3 = spv::Builder::makeUintType(_sampler_id,0x20);
            IVar3 = Converter::Impl::build_vector((Impl *)pCVar1,IVar3,&local_158,2);
            pCVar1 = instruction_local;
            IVar4 = spv::Builder::makeUintType(_sampler_id,0x40);
            pOVar9 = Converter::Impl::allocate((Impl *)pCVar1,OpBitcast,IVar4);
            Operation::add_id(pOVar9,IVar3);
            (&local_128)[extr0._4_4_] = pOVar9->id;
            Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          }
          IVar3 = spv::Builder::makeUintType(_sampler_id,0x40);
          IVar3 = Converter::Impl::build_vector((Impl *)pCVar1,IVar3,&local_128,4);
          if ((sample_type._3_1_ & 1) == 0) {
            Converter::Impl::rewrite_value((Impl *)instruction_local,(Value *)builder,IVar3);
          }
          else {
            pTVar8 = LLVMBC::Value::getType((Value *)builder);
            pTVar8 = LLVMBC::Type::getStructElementType(pTVar8,0);
            Converter::Impl::repack_sparse_feedback
                      ((Impl *)instruction_local,U64,4,(Value *)builder,pTVar8,IVar3);
          }
        }
        impl_local._7_1_ = true;
      }
      else {
        impl_local._7_1_ = false;
      }
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = true;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_texture_gather_instruction(bool compare, bool raw, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, false);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	uint32_t num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	spv::Id coords[4] = {};
	spv::Id offsets[2] = {};
	uint32_t image_flags = 0;

	for (unsigned i = 0; i < num_coords_full; i++)
		coords[i] = impl.get_id_for_value(instruction->getOperand(3 + i));
	spv::Id coord_id = impl.build_vector(builder.makeFloatType(32), coords, num_coords_full);

	if (num_coords == 2 && !get_texel_offsets(impl, instruction, image_flags, 7, num_coords, offsets, true))
		return false;

	spv::Id aux_id;

	if (!raw)
	{
		if (compare)
		{
			// TextureGatherCmp has a component here. Perhaps it is to select depth vs stencil?
			aux_id = impl.get_id_for_value(instruction->getOperand(10));
		}
		else
			aux_id = impl.get_id_for_value(instruction->getOperand(9));
	}
	else
		aux_id = builder.makeUintConstant(0);

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	bool raw_gather64 = raw && instruction->getType()->getStructElementType(0)->getIntegerBitWidth() == 64;

	spv::Op opcode;
	if (compare)
		opcode = sparse ? spv::OpImageSparseDrefGather : spv::OpImageDrefGather;
	else
		opcode = sparse ? spv::OpImageSparseGather : spv::OpImageGather;

	Operation *op = impl.allocate(opcode, instruction, sample_type);
	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_ids({ combined_image_sampler_id, coord_id, aux_id });

	spv::Id texel_offset_id = 0;
	if (image_flags)
	{
		op->add_literal(image_flags);
		texel_offset_id = build_texel_offset_vector(impl, offsets, num_coords, image_flags, true);
		op->add_id(texel_offset_id);
	}

	impl.add(op);

	if (raw_gather64)
	{
		Operation *op_green = impl.allocate(spv::OpImageGather, texel_type);
		op_green->add_ids({ combined_image_sampler_id, coord_id, builder.makeUintConstant(1) });

		if (image_flags)
		{
			op_green->add_literal(image_flags);
			op_green->add_id(texel_offset_id);
		}

		impl.add(op_green);

		spv::Id components64[4];
		spv::Id gather_result;

		if (sparse)
		{
			auto *extract_value = impl.allocate(spv::OpCompositeExtract, texel_type);
			gather_result = extract_value->id;
			extract_value->add_id(op->id);
			extract_value->add_literal(1);
			impl.add(extract_value);
		}
		else
			gather_result = op->id;

		for (unsigned i = 0; i < 4; i++)
		{
			auto *extr0 = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
			auto *extr1 = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));

			extr0->add_id(gather_result);
			extr0->add_literal(i);
			extr1->add_id(op_green->id);
			extr1->add_literal(i);

			impl.add(extr0);
			impl.add(extr1);

			spv::Id components[2] = { extr0->id, extr1->id };
			spv::Id value = impl.build_vector(builder.makeUintType(32), components, 2);
			auto *bitcast_64 = impl.allocate(spv::OpBitcast, builder.makeUintType(64));
			bitcast_64->add_id(value);
			components64[i] = bitcast_64->id;

			impl.add(bitcast_64);
		}

		spv::Id u64_vector = impl.build_vector(builder.makeUintType(64), components64, 4);

		if (sparse)
		{
			auto *target_type = instruction->getType()->getStructElementType(0);
			impl.repack_sparse_feedback(DXIL::ComponentType::U64, 4, instruction, target_type, u64_vector);
		}
		else
		{
			impl.rewrite_value(instruction, u64_vector);
		}
	}
	else
	{
		auto *target_type = instruction->getType()->getStructElementType(0);

		if (sparse)
			impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
		else
		{
			impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
			build_exploded_composite_from_vector(impl, instruction, 4);
		}
	}

	return true;
}